

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O3

void __thiscall
add_file::perform(add_file *this,filesystemcollection *fslist,readercollection *rdlist)

{
  FileReader *__p;
  undefined8 *puVar1;
  ReadWriter_ptr r;
  FileContainer_ptr fs;
  FileReader *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  FileReader *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  long *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  if (1 < g_verbose) {
    printf("adding %s:%s from %s\n",(this->_fsname)._M_dataplus._M_p,
           (this->_romname)._M_dataplus._M_p,(this->_srcpath)._M_dataplus._M_p);
  }
  filesystemcollection::getbyname((filesystemcollection *)&local_28,(string *)fslist);
  if (local_28 != (long *)0x0) {
    __p = (FileReader *)operator_new(0x40);
    FileReader::FileReader(__p,&this->_srcpath);
    local_38 = __p;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<FileReader*>(&local_30,__p);
    local_48 = local_38;
    local_40 = local_30._M_pi;
    if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_30._M_pi)->_M_use_count = (local_30._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_30._M_pi)->_M_use_count = (local_30._M_pi)->_M_use_count + 1;
      }
    }
    (**(code **)(*local_28 + 0x10))(local_28,&this->_romname,&local_48);
    if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
    }
    if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
    }
    if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
    }
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = "add: invalid fsname";
  __cxa_throw(puVar1,&char_const*::typeinfo,0);
}

Assistant:

virtual void perform(filesystemcollection& fslist, readercollection& rdlist)
    {
        if (g_verbose > 1)
            printf("adding %s:%s from %s\n", _fsname.c_str(), _romname.c_str(), _srcpath.c_str());
        FileContainer_ptr fs= fslist.getbyname(_fsname);
        if (!fs) throw "add: invalid fsname";

        ReadWriter_ptr r(new FileReader(_srcpath, FileReader::readonly));
        fs->addfile(_romname, r);
    }